

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O3

void av1_highbd_dr_prediction_z3_c
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_left,int dx,int dy,int bd)

{
  uint16_t uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  byte bVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  uint16_t *puVar19;
  int iVar21;
  undefined1 auVar20 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  int iVar38;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar39;
  int iVar41;
  undefined1 auVar40 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar44 [16];
  ulong local_b0;
  uint16_t *local_98;
  long local_90;
  
  auVar10 = _DAT_004d94a0;
  auVar9 = _DAT_004d9490;
  auVar8 = _DAT_004d7910;
  auVar7 = _DAT_004d7900;
  auVar6 = _DAT_004d78f0;
  if (0 < bw) {
    bVar12 = (byte)upsample_left;
    lVar15 = (long)(bw + bh + -1 << (bVar12 & 0x1f));
    uVar5 = (ulong)(uint)bh;
    local_90 = 0;
    local_b0 = 0;
    iVar17 = dy;
    local_98 = dst;
    do {
      if (0 < bh) {
        uVar11 = (uint)(iVar17 << (bVar12 & 0x1f)) >> 1 & 0x1f;
        lVar14 = (long)(iVar17 >> (6 - bVar12 & 0x1f));
        uVar18 = 0;
        lVar13 = local_90;
        uVar16 = uVar5 + 7;
        puVar19 = local_98;
        do {
          if (lVar15 <= lVar14) {
            if ((int)uVar18 < bh) {
              uVar1 = left[lVar15];
              lVar14 = ~uVar18 + uVar5;
              auVar20._8_4_ = (int)lVar14;
              auVar20._0_8_ = lVar14;
              auVar20._12_4_ = (int)((ulong)lVar14 >> 0x20);
              auVar20 = auVar20 ^ auVar8;
              uVar18 = 0;
              do {
                auVar32._8_4_ = (int)uVar18;
                auVar32._0_8_ = uVar18;
                auVar32._12_4_ = (int)(uVar18 >> 0x20);
                auVar24 = (auVar32 | auVar7) ^ auVar8;
                iVar33 = auVar20._0_4_;
                iVar39 = -(uint)(iVar33 < auVar24._0_4_);
                iVar21 = auVar20._4_4_;
                auVar25._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
                iVar38 = auVar20._8_4_;
                iVar41 = -(uint)(iVar38 < auVar24._8_4_);
                iVar22 = auVar20._12_4_;
                auVar25._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
                auVar35._4_4_ = iVar39;
                auVar35._0_4_ = iVar39;
                auVar35._8_4_ = iVar41;
                auVar35._12_4_ = iVar41;
                auVar42 = pshuflw(in_XMM11,auVar35,0xe8);
                auVar27._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
                auVar27._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
                auVar27._0_4_ = auVar27._4_4_;
                auVar27._8_4_ = auVar27._12_4_;
                auVar44 = pshuflw(in_XMM12,auVar27,0xe8);
                auVar25._0_4_ = auVar25._4_4_;
                auVar25._8_4_ = auVar25._12_4_;
                auVar43 = pshuflw(auVar42,auVar25,0xe8);
                auVar24._8_4_ = 0xffffffff;
                auVar24._0_8_ = 0xffffffffffffffff;
                auVar24._12_4_ = 0xffffffff;
                auVar24 = (auVar43 | auVar44 & auVar42) ^ auVar24;
                auVar24 = packssdw(auVar24,auVar24);
                if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar19 = uVar1;
                }
                auVar25 = auVar27 & auVar35 | auVar25;
                auVar24 = packssdw(auVar25,auVar25);
                auVar43._8_4_ = 0xffffffff;
                auVar43._0_8_ = 0xffffffffffffffff;
                auVar43._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar43,auVar24 ^ auVar43);
                if ((auVar24._0_4_ >> 0x10 & 1) != 0) {
                  *(uint16_t *)((long)dst + lVar13 + stride * 2) = uVar1;
                }
                auVar24 = (auVar32 | auVar6) ^ auVar8;
                iVar39 = -(uint)(iVar33 < auVar24._0_4_);
                auVar40._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
                iVar41 = -(uint)(iVar38 < auVar24._8_4_);
                auVar40._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
                auVar26._4_4_ = iVar39;
                auVar26._0_4_ = iVar39;
                auVar26._8_4_ = iVar41;
                auVar26._12_4_ = iVar41;
                auVar34._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
                auVar34._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
                auVar34._0_4_ = auVar34._4_4_;
                auVar34._8_4_ = auVar34._12_4_;
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar24 = auVar34 & auVar26 | auVar40;
                auVar24 = packssdw(auVar24,auVar24);
                auVar2._8_4_ = 0xffffffff;
                auVar2._0_8_ = 0xffffffffffffffff;
                auVar2._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar2,auVar24 ^ auVar2);
                if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + lVar13 + stride * 4) = uVar1;
                }
                auVar27 = pshufhw(auVar26,auVar26,0x84);
                auVar35 = pshufhw(auVar34,auVar34,0x84);
                auVar25 = pshufhw(auVar27,auVar40,0x84);
                auVar28._8_4_ = 0xffffffff;
                auVar28._0_8_ = 0xffffffffffffffff;
                auVar28._12_4_ = 0xffffffff;
                auVar28 = (auVar25 | auVar35 & auVar27) ^ auVar28;
                auVar27 = packssdw(auVar28,auVar28);
                if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + lVar13 + stride * 6) = uVar1;
                }
                auVar27 = (auVar32 | auVar10) ^ auVar8;
                iVar39 = -(uint)(iVar33 < auVar27._0_4_);
                auVar30._4_4_ = -(uint)(iVar21 < auVar27._4_4_);
                iVar41 = -(uint)(iVar38 < auVar27._8_4_);
                auVar30._12_4_ = -(uint)(iVar22 < auVar27._12_4_);
                auVar36._4_4_ = iVar39;
                auVar36._0_4_ = iVar39;
                auVar36._8_4_ = iVar41;
                auVar36._12_4_ = iVar41;
                auVar24 = pshuflw(auVar24,auVar36,0xe8);
                auVar29._4_4_ = -(uint)(auVar27._4_4_ == iVar21);
                auVar29._12_4_ = -(uint)(auVar27._12_4_ == iVar22);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar27 = pshuflw(auVar44 & auVar42,auVar29,0xe8);
                in_XMM12 = auVar27 & auVar24;
                auVar30._0_4_ = auVar30._4_4_;
                auVar30._8_4_ = auVar30._12_4_;
                auVar24 = pshuflw(auVar24,auVar30,0xe8);
                auVar42._8_4_ = 0xffffffff;
                auVar42._0_8_ = 0xffffffffffffffff;
                auVar42._12_4_ = 0xffffffff;
                auVar42 = (auVar24 | in_XMM12) ^ auVar42;
                in_XMM11 = packssdw(auVar42,auVar42);
                if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + lVar13 + stride * 8) = uVar1;
                }
                auVar30 = auVar29 & auVar36 | auVar30;
                auVar24 = packssdw(auVar30,auVar30);
                auVar44._8_4_ = 0xffffffff;
                auVar44._0_8_ = 0xffffffffffffffff;
                auVar44._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar44,auVar24 ^ auVar44);
                if ((auVar24 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + lVar13 + stride * 10) = uVar1;
                }
                auVar24 = (auVar32 | auVar9) ^ auVar8;
                iVar33 = -(uint)(iVar33 < auVar24._0_4_);
                auVar37._4_4_ = -(uint)(iVar21 < auVar24._4_4_);
                iVar38 = -(uint)(iVar38 < auVar24._8_4_);
                auVar37._12_4_ = -(uint)(iVar22 < auVar24._12_4_);
                auVar31._4_4_ = iVar33;
                auVar31._0_4_ = iVar33;
                auVar31._8_4_ = iVar38;
                auVar31._12_4_ = iVar38;
                auVar23._4_4_ = -(uint)(auVar24._4_4_ == iVar21);
                auVar23._12_4_ = -(uint)(auVar24._12_4_ == iVar22);
                auVar23._0_4_ = auVar23._4_4_;
                auVar23._8_4_ = auVar23._12_4_;
                auVar37._0_4_ = auVar37._4_4_;
                auVar37._8_4_ = auVar37._12_4_;
                auVar24 = auVar23 & auVar31 | auVar37;
                auVar24 = packssdw(auVar24,auVar24);
                auVar3._8_4_ = 0xffffffff;
                auVar3._0_8_ = 0xffffffffffffffff;
                auVar3._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 ^ auVar3,auVar24 ^ auVar3);
                if ((auVar24 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + lVar13 + stride * 0xc) = uVar1;
                }
                auVar32 = pshufhw(auVar31,auVar31,0x84);
                auVar24 = pshufhw(auVar23,auVar23,0x84);
                auVar27 = pshufhw(auVar32,auVar37,0x84);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar24 = packssdw(auVar24 & auVar32,(auVar27 | auVar24 & auVar32) ^ auVar4);
                if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + lVar13 + stride * 0xe) = uVar1;
                }
                uVar18 = uVar18 + 8;
                puVar19 = puVar19 + stride * 8;
                lVar13 = lVar13 + stride * 0x10;
              } while ((uVar16 & 0xfffffffffffffff8) != uVar18);
            }
            break;
          }
          dst[local_b0 + uVar18 * stride] =
               (uint16_t)
               (left[lVar14 + 1] * uVar11 + (uint)left[lVar14] * (0x20 - uVar11) + 0x10 >> 5);
          uVar18 = uVar18 + 1;
          lVar14 = lVar14 + (1 << (bVar12 & 0x1f));
          uVar16 = uVar16 - 1;
          puVar19 = puVar19 + stride;
          lVar13 = lVar13 + stride * 2;
        } while (uVar18 != uVar5);
      }
      local_b0 = local_b0 + 1;
      iVar17 = iVar17 + dy;
      local_98 = local_98 + 1;
      local_90 = local_90 + 2;
    } while (local_b0 != (uint)bw);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z3_c(uint16_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint16_t *above,
                                   const uint16_t *left, int upsample_left,
                                   int dx, int dy, int bd) {
  int r, c, y, base, shift, val;

  (void)above;
  (void)dx;
  (void)bd;
  assert(dx == 1);
  assert(dy > 0);

  const int max_base_y = (bw + bh - 1) << upsample_left;
  const int frac_bits = 6 - upsample_left;
  const int base_inc = 1 << upsample_left;
  y = dy;
  for (c = 0; c < bw; ++c, y += dy) {
    base = y >> frac_bits;
    shift = ((y << upsample_left) & 0x3F) >> 1;

    for (r = 0; r < bh; ++r, base += base_inc) {
      if (base < max_base_y) {
        val = left[base] * (32 - shift) + left[base + 1] * shift;
        dst[r * stride + c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        for (; r < bh; ++r) dst[r * stride + c] = left[max_base_y];
        break;
      }
    }
  }
}